

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,counting_iterator<char> *it)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  char cVar4;
  byte *pbVar5;
  ulong uVar6;
  byte bStack_49;
  char buffer [66];
  
  pcVar3 = (char *)it->count_;
  cVar4 = it->blackhole_;
  iVar1 = *(int *)(this + 8);
  pbVar5 = (byte *)(buffer + (long)iVar1 + -1);
  uVar6 = *(ulong *)this;
  do {
    *pbVar5 = (byte)uVar6 & 1 | 0x30;
    pbVar5 = pbVar5 + -1;
    bVar2 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar2);
  if (0 < iVar1) {
    pcVar3 = buffer + (long)(pcVar3 + ((long)iVar1 - (long)buffer));
    cVar4 = buffer[(long)iVar1 + -1];
  }
  it->count_ = (size_t)pcVar3;
  it->blackhole_ = cVar4;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }